

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O0

void gpc_bckc(Pixel *out,Pixel *in,Background *back)

{
  byte bVar1;
  double dVar2;
  double a;
  Background *back_local;
  Pixel *in_local;
  Pixel *out_local;
  
  if (in->a < 1) {
    out->r = back->ir;
    out->g = back->ig;
    out->b = back->ib;
  }
  else if (in->a < 0xff) {
    dVar2 = (double)in->a / 255.0;
    bVar1 = sRGB(sRGB_to_d[in->r] * dVar2 + back->dr * (1.0 - dVar2));
    out->r = (uint)bVar1;
    bVar1 = sRGB(sRGB_to_d[in->g] * dVar2 + back->dg * (1.0 - dVar2));
    out->g = (uint)bVar1;
    bVar1 = sRGB(sRGB_to_d[in->b] * dVar2 + back->db * (1.0 - dVar2));
    out->b = (uint)bVar1;
  }
  else {
    out->r = in->r;
    out->g = in->g;
    out->b = in->b;
  }
  out->a = 0xff;
  return;
}

Assistant:

static void
gpc_bckc(Pixel *out, const Pixel *in, const Background *back)
{
   if (in->a <= 0)
   {
      out->r = back->ir;
      out->g = back->ig;
      out->b = back->ib;
   }

   else if (in->a >= 255)
   {
      out->r = in->r;
      out->g = in->g;
      out->b = in->b;
   }

   else
   {
      double a = in->a / 255.;

      out->r = sRGB(sRGB_to_d[in->r] * a + back->dr * (1-a));
      out->g = sRGB(sRGB_to_d[in->g] * a + back->dg * (1-a));
      out->b = sRGB(sRGB_to_d[in->b] * a + back->db * (1-a));
   }

   out->a = 255;
}